

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O2

void buildXDBsortedAtomRecs(xformDatabase *xdb)

{
  int iVar1;
  xformAtomRecords **__base;
  transformData *ptVar2;
  xformAtomRecords *pxVar3;
  size_t __nmemb;
  xformAtomRecords **ppxVar4;
  
  if (xdb != (xformDatabase *)0x0) {
    iVar1 = 0;
    ptVar2 = (transformData *)xdb;
    while (ptVar2 = ptVar2->next, ptVar2 != (transformData *)0x0) {
      pxVar3 = (xformAtomRecords *)&ptVar2->recs;
      iVar1 = iVar1 + -1;
      do {
        pxVar3 = pxVar3->next;
        iVar1 = iVar1 + 1;
      } while (pxVar3 != (xformAtomRecords *)0x0);
    }
    __base = (xformAtomRecords **)malloc((long)iVar1 * 8 + 8);
    if (__base == (xformAtomRecords **)0x0) {
      errmsg("could not create atom sorted-order array");
      __base = (xformAtomRecords **)0x0;
    }
    else {
      iVar1 = 0;
      ptVar2 = (transformData *)xdb;
      while( true ) {
        ptVar2 = ptVar2->next;
        __nmemb = (size_t)iVar1;
        if (ptVar2 == (transformData *)0x0) break;
        pxVar3 = (xformAtomRecords *)&ptVar2->recs;
        ppxVar4 = __base + __nmemb;
        while (pxVar3 = pxVar3->next, pxVar3 != (xformAtomRecords *)0x0) {
          *ppxVar4 = pxVar3;
          iVar1 = iVar1 + 1;
          ppxVar4 = ppxVar4 + 1;
        }
      }
      __base[__nmemb] = (xformAtomRecords *)0x0;
      qsort(__base,__nmemb,8,compareXDBAtomRecs);
    }
    xdb->sortedByRes = __base;
  }
  return;
}

Assistant:

void buildXDBsortedAtomRecs(xformDatabase* xdb) {
   transformData *xform = NULL;
   xformAtomRecords *xa = NULL;
   xformAtomRecords **srtvec = NULL;
   int n = 0;

   if (xdb) {
      n = 0; /* first count the number of atoms */
      for (xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    n++;
	 }
      }

      /* build an array with extra room for a terminating null pointer */
      srtvec = (xformAtomRecords**)malloc((n + 1)*sizeof(xformAtomRecords*));
      if (!srtvec) {
	 errmsg("could not create atom sorted-order array");
	 xdb->sortedByRes = NULL;
	 return;
      }

      n = 0; /* now we store pointers to the AtomRecs in the array */
      for (xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    srtvec[n] = xa;
	    n++;
	 }
      }
      srtvec[n] = NULL; /* array ends with a NULL */

      qsort(&(srtvec[0]), n, sizeof(xformAtomRecords*), compareXDBAtomRecs);

      xdb->sortedByRes = srtvec; /* stash away the sorted array */
   }
}